

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

type __thiscall
httplib::detail::
make_unique<httplib::ClientImpl,char_const*&,int,std::__cxx11::string_const&,std::__cxx11::string_const&>
          (detail *this,char **args,int *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  char *__s;
  ClientImpl *this_00;
  allocator<char> local_51;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  int *args_local_1;
  char **args_local;
  
  local_30 = args_3;
  args_local_3 = args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = (int *)args;
  args_local = (char **)this;
  this_00 = (ClientImpl *)operator_new(0x2b8);
  __s = *(char **)args_local_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
  ClientImpl::ClientImpl(this_00,&local_50,*(int *)args_local_2,args_local_3,local_30);
  std::unique_ptr<httplib::ClientImpl,std::default_delete<httplib::ClientImpl>>::
  unique_ptr<std::default_delete<httplib::ClientImpl>,void>
            ((unique_ptr<httplib::ClientImpl,std::default_delete<httplib::ClientImpl>> *)this,
             this_00);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return (__uniq_ptr_data<httplib::ClientImpl,_std::default_delete<httplib::ClientImpl>,_true,_true>
         )(__uniq_ptr_data<httplib::ClientImpl,_std::default_delete<httplib::ClientImpl>,_true,_true>
           )this;
}

Assistant:

typename std::enable_if<!std::is_array<T>::value, std::unique_ptr<T>>::type
		make_unique(Args &&... args) {
			return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
		}